

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.cc
# Opt level: O2

flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* __thiscall
google::protobuf::compiler::cpp::UnknownFieldsVars_abi_cxx11_
          (flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *__return_storage_ptr__,cpp *this,Descriptor *desc,Options *opts)

{
  bool bVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  Descriptor *this_00;
  AlphaNum *in_R8;
  AlphaNum *pAVar3;
  Arg *in_R9;
  long lVar4;
  string_view format;
  string_view format_00;
  allocator_type local_1fb;
  key_equal local_1fa;
  hasher local_1f9;
  string unknown_fields_type;
  string default_instance;
  string local_1b8;
  string local_198;
  AlphaNum local_178;
  AlphaNum local_148;
  AlphaNum local_118;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e8;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b8;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_88;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  
  unknown_fields_type._M_dataplus._M_p = (pointer)&unknown_fields_type.field_2;
  unknown_fields_type._M_string_length = 0;
  paVar2 = &default_instance.field_2;
  default_instance._M_string_length = 0;
  unknown_fields_type.field_2._M_local_buf[0] = '\0';
  default_instance.field_2._M_local_buf[0] = '\0';
  this_00 = desc;
  default_instance._M_dataplus._M_p = (pointer)paVar2;
  bVar1 = UseUnknownFieldSet(*(FileDescriptor **)(this + 0x18),(Options *)desc);
  if (bVar1) {
    local_e8.first = absl::lts_20250127::NullSafeStringView("::");
    bVar1 = *(char *)((long)&desc[1].options_ + 2) != '\0';
    local_118.piece_._M_len = 6;
    if (bVar1) {
      local_118.piece_._M_len = 0x10;
    }
    local_118.piece_._M_str = "proto2";
    if (bVar1) {
      local_118.piece_._M_str = "google::protobuf";
    }
    local_148.piece_ = absl::lts_20250127::NullSafeStringView("::UnknownFieldSet");
    absl::lts_20250127::StrCat_abi_cxx11_
              ((string *)&local_178,(lts_20250127 *)&local_e8,&local_118,&local_148,in_R8);
    std::__cxx11::string::operator=((string *)&unknown_fields_type,(string *)&local_178);
    std::__cxx11::string::~string((string *)&local_178);
    local_e8.first._M_str = unknown_fields_type._M_dataplus._M_p;
    local_e8.first._M_len = unknown_fields_type._M_string_length;
    local_118.piece_ = absl::lts_20250127::NullSafeStringView("::default_instance");
    absl::lts_20250127::StrCat_abi_cxx11_
              ((string *)&local_148,(lts_20250127 *)&local_e8,&local_118,&local_118);
    pAVar3 = &local_148;
  }
  else {
    PrimitiveTypeName_abi_cxx11_
              ((string *)&local_e8,(cpp *)this_00,(Options *)&DAT_00000009,(CppType)paVar2);
    std::__cxx11::string::operator=((string *)&unknown_fields_type,(string *)&local_e8);
    std::__cxx11::string::~string((string *)&local_e8);
    local_e8.first = absl::lts_20250127::NullSafeStringView("::");
    bVar1 = *(char *)((long)&desc[1].options_ + 2) != '\0';
    local_118.piece_._M_len = 6;
    if (bVar1) {
      local_118.piece_._M_len = 0x10;
    }
    local_118.piece_._M_str = "proto2";
    if (bVar1) {
      local_118.piece_._M_str = "google::protobuf";
    }
    local_148.piece_ = absl::lts_20250127::NullSafeStringView("::internal::GetEmptyString");
    absl::lts_20250127::StrCat_abi_cxx11_
              ((string *)&local_178,(lts_20250127 *)&local_e8,&local_118,&local_148,in_R8);
    pAVar3 = &local_178;
  }
  std::__cxx11::string::operator=((string *)&default_instance,(string *)pAVar3);
  std::__cxx11::string::~string((string *)pAVar3);
  local_118.piece_._M_str = unknown_fields_type._M_dataplus._M_p;
  local_118.piece_._M_len = unknown_fields_type._M_string_length;
  pAVar3 = &local_148;
  local_148.piece_._M_str = default_instance._M_dataplus._M_p;
  local_148.piece_._M_len = default_instance._M_string_length;
  format._M_str = (char *)&local_118;
  format._M_len = (size_t)"_internal_metadata_.unknown_fields<$0>($1)";
  absl::lts_20250127::Substitute_abi_cxx11_
            (&local_198,(lts_20250127 *)&DAT_0000002a,format,(Arg *)pAVar3,in_R9);
  std::
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_(&)[15],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_e8,(char (*) [15])0xfafc2d,&local_198);
  std::
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_(&)[20],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
            (&local_b8,(char (*) [20])"unknown_fields_type",&unknown_fields_type);
  std::
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[20],_const_char_(&)[42],_true>
            (&local_88,(char (*) [20])"have_unknown_fields",
             (char (*) [42])"_internal_metadata_.have_unknown_fields()");
  local_178.piece_._M_len = unknown_fields_type._M_string_length;
  local_178.piece_._M_str = unknown_fields_type._M_dataplus._M_p;
  format_00._M_str = (char *)&local_178;
  format_00._M_len = (size_t)"_internal_metadata_.mutable_unknown_fields<$0>()";
  absl::lts_20250127::Substitute_abi_cxx11_
            (&local_1b8,(lts_20250127 *)&DAT_00000030,format_00,(Arg *)pAVar3);
  std::
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_(&)[23],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_58,(char (*) [23])"mutable_unknown_fields",&local_1b8);
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
  ::
  raw_hash_set<std::pair<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>const*>
            ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>
              *)__return_storage_ptr__,&local_e8,
             (pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&stack0xffffffffffffffd8,0,&local_1f9,&local_1fa,&local_1fb);
  lVar4 = 0xa0;
  do {
    std::__cxx11::string::~string((string *)((long)&local_e8.first._M_len + lVar4));
    lVar4 = lVar4 + -0x30;
  } while (lVar4 != -0x20);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::__cxx11::string::~string((string *)&local_198);
  std::__cxx11::string::~string((string *)&default_instance);
  std::__cxx11::string::~string((string *)&unknown_fields_type);
  return __return_storage_ptr__;
}

Assistant:

absl::flat_hash_map<absl::string_view, std::string> UnknownFieldsVars(
    const Descriptor* desc, const Options& opts) {
  std::string unknown_fields_type;
  std::string default_instance;
  if (UseUnknownFieldSet(desc->file(), opts)) {
    unknown_fields_type =
        absl::StrCat("::", ProtobufNamespace(opts), "::UnknownFieldSet");
    default_instance = absl::StrCat(unknown_fields_type, "::default_instance");
  } else {
    unknown_fields_type =
        PrimitiveTypeName(opts, FieldDescriptor::CPPTYPE_STRING);
    default_instance = absl::StrCat("::", ProtobufNamespace(opts),
                                    "::internal::GetEmptyString");
  }

  return {
      {"unknown_fields",
       absl::Substitute("_internal_metadata_.unknown_fields<$0>($1)",
                        unknown_fields_type, default_instance)},
      {"unknown_fields_type", unknown_fields_type},
      {"have_unknown_fields", "_internal_metadata_.have_unknown_fields()"},
      {"mutable_unknown_fields",
       absl::Substitute("_internal_metadata_.mutable_unknown_fields<$0>()",
                        unknown_fields_type)},
  };
}